

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

bool __thiscall ASDCP::MXF::RIP::GetPairBySID(RIP *this,ui32_t SID,PartitionPair *outPair)

{
  bool bVar1;
  pointer pPVar2;
  reference pPVar3;
  _Self local_40;
  _List_node_base *local_38;
  _List_const_iterator<ASDCP::MXF::RIP::PartitionPair> local_30;
  const_pair_iterator i;
  PartitionPair *outPair_local;
  ui32_t SID_local;
  RIP *this_local;
  
  i._M_node = (_List_node_base *)outPair;
  std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::_List_const_iterator(&local_30);
  local_38 = (_List_node_base *)
             std::__cxx11::
             list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::
             begin(&(this->PairArray).
                    super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                  );
  local_30._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::end
                   (&(this->PairArray).
                     super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                   );
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) {
      return false;
    }
    pPVar2 = std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator->(&local_30);
    if (pPVar2->BodySID == SID) break;
    std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator++(&local_30);
  }
  pPVar3 = std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator*(&local_30);
  PartitionPair::operator=((PartitionPair *)i._M_node,pPVar3);
  return true;
}

Assistant:

bool
ASDCP::MXF::RIP::GetPairBySID(ui32_t SID, PartitionPair& outPair) const
{
  RIP::const_pair_iterator i;
  for ( i = PairArray.begin(); i != PairArray.end(); ++i )
    {
      if ( i->BodySID == SID )
	{
	  outPair = *i;
	  return true;
	}
    }

  return false;
}